

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMin(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *p_delta,int start,int incr)

{
  fpclass_type fVar1;
  int32_t iVar2;
  Real RVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  Status SVar7;
  int iVar8;
  long lVar9;
  pointer pnVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  pointer pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  undefined4 *puVar15;
  pointer pnVar16;
  undefined4 *puVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  uint uVar20;
  ulong uVar21;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar22;
  long in_FS_OFFSET;
  byte bVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_1038 [120];
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_fc0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_fb0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_fa8;
  undefined8 uStack_fa0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f98;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f90;
  cpp_dec_float<200U,_int,_void> *local_f88;
  undefined8 uStack_f80;
  undefined1 local_f78 [120];
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f00;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ef8;
  undefined8 uStack_ef0;
  double local_ee0;
  pointer local_ed8;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ed0;
  undefined1 local_ec8 [128];
  double local_e48;
  undefined8 uStack_e40;
  cpp_dec_float<200U,_int,_void> *local_e38;
  Random *local_e30;
  undefined1 local_e28 [124];
  int32_t iStack_dac;
  Random *local_da8;
  undefined8 uStack_da0;
  undefined1 local_d98 [128];
  cpp_dec_float<200U,_int,_void> local_d18;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined5 uStack_c30;
  undefined3 uStack_c2b;
  undefined5 uStack_c28;
  undefined8 local_c20;
  cpp_dec_float<200U,_int,_void> local_c18;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined5 uStack_b30;
  undefined3 uStack_b2b;
  undefined5 uStack_b28;
  undefined8 local_b20;
  cpp_dec_float<200U,_int,_void> local_b18;
  cpp_dec_float<200U,_int,_void> local_a98;
  cpp_dec_float<200U,_int,_void> local_a10;
  cpp_dec_float<200U,_int,_void> local_990;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_910;
  undefined1 local_890 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_810;
  undefined1 local_790 [128];
  undefined1 local_710 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_690;
  undefined1 local_610 [128];
  undefined1 local_590 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_510;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_490;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_410;
  undefined1 local_390 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_290;
  undefined1 local_210 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_190;
  undefined4 local_110 [28];
  undefined4 local_a0 [28];
  
  bVar23 = 0;
  local_ed8 = (uvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_a98.fpclass = cpp_dec_float_finite;
  local_a98.prec_elem = 0x1c;
  local_a98.data._M_elems[0] = 0;
  local_a98.data._M_elems[1] = 0;
  local_a98.data._M_elems[2] = 0;
  local_a98.data._M_elems[3] = 0;
  local_a98.data._M_elems[4] = 0;
  local_a98.data._M_elems[5] = 0;
  local_a98.data._M_elems[6] = 0;
  local_a98.data._M_elems[7] = 0;
  local_a98.data._M_elems[8] = 0;
  local_a98.data._M_elems[9] = 0;
  local_a98.data._M_elems[10] = 0;
  local_a98.data._M_elems[0xb] = 0;
  local_a98.data._M_elems[0xc] = 0;
  local_a98.data._M_elems[0xd] = 0;
  local_a98.data._M_elems[0xe] = 0;
  local_a98.data._M_elems[0xf] = 0;
  local_a98.data._M_elems[0x10] = 0;
  local_a98.data._M_elems[0x11] = 0;
  local_a98.data._M_elems[0x12] = 0;
  local_a98.data._M_elems[0x13] = 0;
  local_a98.data._M_elems[0x14] = 0;
  local_a98.data._M_elems[0x15] = 0;
  local_a98.data._M_elems[0x16] = 0;
  local_a98.data._M_elems[0x17] = 0;
  local_a98.data._M_elems[0x18] = 0;
  local_a98.data._M_elems[0x19] = 0;
  local_a98.data._M_elems._104_5_ = 0;
  local_a98.data._M_elems[0x1b]._1_3_ = 0;
  local_a98.exp = 0;
  local_a98.neg = false;
  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x1c00000000;
  local_1038._0_4_ = 0;
  local_1038._4_4_ = 0;
  local_1038._8_4_ = 0;
  local_1038._12_4_ = 0;
  local_1038._16_4_ = 0;
  local_1038._20_4_ = 0;
  local_1038._24_4_ = 0;
  local_1038._28_4_ = 0;
  local_1038._32_4_ = 0;
  local_1038._36_4_ = 0;
  local_1038._40_4_ = 0;
  local_1038._44_4_ = 0;
  local_1038._48_4_ = 0;
  local_1038._52_4_ = 0;
  local_1038._56_4_ = 0;
  local_1038._60_4_ = 0;
  local_1038._64_4_ = 0;
  local_1038._68_4_ = 0;
  local_1038._72_4_ = 0;
  local_1038._76_4_ = 0;
  local_1038._80_4_ = 0;
  local_1038._84_4_ = 0;
  local_1038._88_4_ = 0;
  local_1038._92_4_ = 0;
  local_1038._96_4_ = 0;
  local_1038._100_4_ = 0;
  local_1038._104_5_ = 0;
  local_1038._109_3_ = 0;
  local_1038._112_4_ = 0;
  local_1038[0x74] = false;
  local_fb0 = this;
  local_fa8 = uvec;
  local_f90 = p_low;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_1038,10.0);
  if (&local_a98 != &p_delta->m_backend) {
    pnVar14 = p_delta;
    pcVar12 = &local_a98;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar12->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_a98.exp = (p_delta->m_backend).exp;
    local_a98.neg = (p_delta->m_backend).neg;
    local_a98.fpclass = (p_delta->m_backend).fpclass;
    local_a98.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_a98,(cpp_dec_float<200U,_int,_void> *)local_1038);
  local_b18.fpclass = cpp_dec_float_finite;
  local_b18.prec_elem = 0x1c;
  local_b18.data._M_elems[0] = 0;
  local_b18.data._M_elems[1] = 0;
  local_b18.data._M_elems[2] = 0;
  local_b18.data._M_elems[3] = 0;
  local_b18.data._M_elems[4] = 0;
  local_b18.data._M_elems[5] = 0;
  local_b18.data._M_elems[6] = 0;
  local_b18.data._M_elems[7] = 0;
  local_b18.data._M_elems[8] = 0;
  local_b18.data._M_elems[9] = 0;
  local_b18.data._M_elems[10] = 0;
  local_b18.data._M_elems[0xb] = 0;
  local_b18.data._M_elems[0xc] = 0;
  local_b18.data._M_elems[0xd] = 0;
  local_b18.data._M_elems[0xe] = 0;
  local_b18.data._M_elems[0xf] = 0;
  local_b18.data._M_elems[0x10] = 0;
  local_b18.data._M_elems[0x11] = 0;
  local_b18.data._M_elems[0x12] = 0;
  local_b18.data._M_elems[0x13] = 0;
  local_b18.data._M_elems[0x14] = 0;
  local_b18.data._M_elems[0x15] = 0;
  local_b18.data._M_elems[0x16] = 0;
  local_b18.data._M_elems[0x17] = 0;
  local_b18.data._M_elems[0x18] = 0;
  local_b18.data._M_elems[0x19] = 0;
  local_b18.data._M_elems._104_5_ = 0;
  local_b18.data._M_elems[0x1b]._1_3_ = 0;
  local_b18.exp = 0;
  local_b18.neg = false;
  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x1c00000000;
  local_1038._0_4_ = 0;
  local_1038._4_4_ = 0;
  local_1038._8_4_ = 0;
  local_1038._12_4_ = 0;
  local_1038._16_4_ = 0;
  local_1038._20_4_ = 0;
  local_1038._24_4_ = 0;
  local_1038._28_4_ = 0;
  local_1038._32_4_ = 0;
  local_1038._36_4_ = 0;
  local_1038._40_4_ = 0;
  local_1038._44_4_ = 0;
  local_1038._48_4_ = 0;
  local_1038._52_4_ = 0;
  local_1038._56_4_ = 0;
  local_1038._60_4_ = 0;
  local_1038._64_4_ = 0;
  local_1038._68_4_ = 0;
  local_1038._72_4_ = 0;
  local_1038._76_4_ = 0;
  local_1038._80_4_ = 0;
  local_1038._84_4_ = 0;
  local_1038._88_4_ = 0;
  local_1038._92_4_ = 0;
  local_1038._96_4_ = 0;
  local_1038._100_4_ = 0;
  local_1038._104_5_ = 0;
  local_1038._109_3_ = 0;
  local_1038._112_4_ = 0;
  local_1038[0x74] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_1038,100.0);
  if (&local_b18 != &p_delta->m_backend) {
    pnVar14 = p_delta;
    pcVar12 = &local_b18;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar12->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_b18.exp = (p_delta->m_backend).exp;
    local_b18.neg = (p_delta->m_backend).neg;
    local_b18.fpclass = (p_delta->m_backend).fpclass;
    local_b18.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_b18,(cpp_dec_float<200U,_int,_void> *)local_1038);
  local_d98._0_4_ = 0;
  local_d98._4_4_ = 0;
  local_d98._8_4_ = 0;
  local_d98._12_4_ = 0;
  local_d98._16_4_ = 0;
  local_d98._20_4_ = 0;
  local_d98._24_4_ = 0;
  local_d98._28_4_ = 0;
  local_d98._32_4_ = 0;
  local_d98._36_4_ = 0;
  local_d98._40_4_ = 0;
  local_d98._44_4_ = 0;
  local_d98._48_4_ = 0;
  local_d98._52_4_ = 0;
  local_d98._56_4_ = 0;
  local_d98._60_4_ = 0;
  local_d98._64_4_ = 0;
  local_d98._68_4_ = 0;
  local_d98._72_4_ = 0;
  local_d98._76_4_ = 0;
  local_d98._80_4_ = 0;
  local_d98._84_4_ = 0;
  local_d98._88_4_ = 0;
  local_d98._92_4_ = 0;
  local_d98._96_4_ = 0;
  local_d98._100_4_ = 0;
  local_d98._104_5_ = 0;
  local_d98._109_3_ = 0;
  local_ec8._0_4_ = 0;
  local_ec8._4_4_ = 0;
  local_ec8._8_4_ = 0;
  local_ec8._12_4_ = 0;
  local_ec8._16_4_ = 0;
  local_ec8._20_4_ = 0;
  local_ec8._24_4_ = 0;
  local_ec8._28_4_ = 0;
  local_ec8._32_4_ = 0;
  local_ec8._36_4_ = 0;
  local_ec8._40_4_ = 0;
  local_ec8._44_4_ = 0;
  local_ec8._48_4_ = 0;
  local_ec8._52_4_ = 0;
  local_ec8._56_4_ = 0;
  local_ec8._60_4_ = 0;
  local_ec8._64_4_ = 0;
  local_ec8._68_4_ = 0;
  local_ec8._72_4_ = 0;
  local_ec8._76_4_ = 0;
  local_ec8._80_4_ = 0;
  local_ec8._84_4_ = 0;
  local_ec8._88_4_ = 0;
  local_ec8._92_4_ = 0;
  local_ec8._96_4_ = 0;
  local_ec8._100_4_ = 0;
  local_ec8._104_5_ = 0;
  local_ec8._109_3_ = 0;
  local_e28._0_4_ = 0;
  local_e28._4_4_ = 0;
  local_e28._8_4_ = 0;
  local_e28._12_4_ = 0;
  local_e28._16_4_ = 0;
  local_e28._20_4_ = 0;
  local_e28._24_4_ = 0;
  local_e28._28_4_ = 0;
  local_e28._32_4_ = 0;
  local_e28._36_4_ = 0;
  local_e28._40_4_ = 0;
  local_e28._44_4_ = 0;
  local_e28._48_4_ = 0;
  local_e28._52_4_ = 0;
  local_e28._56_4_ = 0;
  local_e28._60_4_ = 0;
  local_e28._64_4_ = 0;
  local_e28._68_4_ = 0;
  local_e28._72_4_ = 0;
  local_e28._76_4_ = 0;
  local_e28._80_4_ = 0;
  local_e28._84_4_ = 0;
  local_e28._88_4_ = 0;
  local_e28._92_4_ = 0;
  local_e28._96_4_ = 0;
  local_e28._100_4_ = 0;
  local_e28._104_5_ = 0;
  local_e28._109_3_ = 0;
  local_f98 = p_up;
  if (local_fb0->fullPerturbation == true) {
    pnVar14 = p_delta;
    pnVar18 = eps;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    (eps->m_backend).exp = (p_delta->m_backend).exp;
    (eps->m_backend).neg = (p_delta->m_backend).neg;
    iVar2 = (p_delta->m_backend).prec_elem;
    (eps->m_backend).fpclass = (p_delta->m_backend).fpclass;
    (eps->m_backend).prec_elem = iVar2;
    uVar20 = (int)((ulong)((long)(local_fa8->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_fa8->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 7) + ~start;
    if (-1 < (int)uVar20) {
      local_f88 = *(cpp_dec_float<200U,_int,_void> **)(in_FS_OFFSET + -8);
      local_da8 = &local_fb0->random;
      local_fb0 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_fb0->theShift;
      uStack_f80 = 0;
      local_ef8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)-(double)local_f88;
      uStack_ef0 = 0x8000000000000000;
      do {
        uVar21 = (ulong)uVar20;
        pnVar10 = (p_up->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_ed0 = (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)uVar21;
        pnVar13 = pnVar10 + uVar21;
        puVar11 = (uint *)local_e28;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar11 = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
        }
        iVar6 = pnVar10[uVar21].m_backend.exp;
        local_e28._112_4_ = iVar6;
        bVar5 = pnVar10[uVar21].m_backend.neg;
        local_e28[0x74] = bVar5;
        fVar1 = pnVar10[uVar21].m_backend.fpclass;
        iVar2 = pnVar10[uVar21].m_backend.prec_elem;
        iStack_dac = iVar2;
        local_e28._120_4_ = fVar1;
        pnVar10 = (local_f90->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar13 = pnVar10 + uVar21;
        puVar11 = (uint *)local_ec8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar11 = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
        }
        local_ec8._112_4_ = pnVar10[uVar21].m_backend.exp;
        local_ec8[0x74] = pnVar10[uVar21].m_backend.neg;
        local_ec8._120_4_ = pnVar10[uVar21].m_backend.fpclass;
        local_ec8._124_4_ = pnVar10[uVar21].m_backend.prec_elem;
        pnVar10 = local_ed8 + uVar21;
        puVar15 = (undefined4 *)local_d98;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = *(undefined4 *)&pnVar10->m_backend;
          pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_d98._112_4_ = *(int *)((long)(local_ed8 + uVar21) + 0x70);
        local_d98[0x74] = *(bool *)((long)(local_ed8 + uVar21) + 0x74);
        local_d98._120_8_ =
             *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **)((long)(local_ed8 + uVar21) + 0x78);
        puVar11 = (uint *)local_e28;
        pnVar14 = &local_910;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = *puVar11;
          puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        local_910.m_backend.exp = iVar6;
        local_910.m_backend.neg = bVar5;
        local_910.m_backend.fpclass = fVar1;
        local_910.m_backend.prec_elem = iVar2;
        ::soplex::infinity::__tls_init();
        local_b20 = 0x1c00000000;
        local_b98 = 0;
        uStack_b90 = 0;
        local_b88 = 0;
        uStack_b80 = 0;
        local_b78 = 0;
        uStack_b70 = 0;
        local_b68 = 0;
        uStack_b60 = 0;
        local_b58 = 0;
        uStack_b50 = 0;
        local_b48 = 0;
        uStack_b40 = 0;
        local_b38 = 0;
        uStack_b30 = 0;
        uStack_b2b = 0;
        uStack_b28 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_b98,(double)local_f88);
        pnVar14 = eps;
        pnVar18 = &local_190;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        local_190.m_backend.exp = (eps->m_backend).exp;
        local_190.m_backend.neg = (eps->m_backend).neg;
        local_190.m_backend.fpclass = (eps->m_backend).fpclass;
        local_190.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_910,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_b98,&local_190);
        if (bVar5) {
          puVar11 = (uint *)local_ec8;
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_210;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_210._112_4_ = local_ec8._112_4_;
          local_210[0x74] = local_ec8[0x74];
          local_210._120_8_ = local_ec8._120_8_;
          puVar11 = (uint *)local_e28;
          pnVar14 = &local_290;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_290.m_backend.exp = local_e28._112_4_;
          local_290.m_backend.neg = local_e28[0x74];
          local_290.m_backend.fpclass = local_e28._120_4_;
          local_290.m_backend.prec_elem = iStack_dac;
          pnVar14 = eps;
          pnVar18 = &local_310;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_310.m_backend.exp = (eps->m_backend).exp;
          local_310.m_backend.neg = (eps->m_backend).neg;
          local_310.m_backend.fpclass = (eps->m_backend).fpclass;
          local_310.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar5 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_210,&local_290,&local_310);
          if (bVar5) {
            local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x1c00000000;
            local_1038._0_4_ = 0;
            local_1038._4_4_ = 0;
            local_1038._8_4_ = 0;
            local_1038._12_4_ = 0;
            local_1038._16_4_ = 0;
            local_1038._20_4_ = 0;
            local_1038._24_4_ = 0;
            local_1038._28_4_ = 0;
            local_1038._32_4_ = 0;
            local_1038._36_4_ = 0;
            local_1038._40_4_ = 0;
            local_1038._44_4_ = 0;
            local_1038._48_4_ = 0;
            local_1038._52_4_ = 0;
            local_1038._56_4_ = 0;
            local_1038._60_4_ = 0;
            local_1038._64_4_ = 0;
            local_1038._68_4_ = 0;
            local_1038._72_4_ = 0;
            local_1038._76_4_ = 0;
            local_1038._80_4_ = 0;
            local_1038._84_4_ = 0;
            local_1038._88_4_ = 0;
            local_1038._92_4_ = 0;
            local_1038._96_4_ = 0;
            local_1038._100_4_ = 0;
            local_1038._104_5_ = 0;
            local_1038._109_3_ = 0;
            local_1038._112_4_ = 0;
            local_1038[0x74] = false;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d98;
            if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_1038 != eps) {
              puVar11 = (uint *)local_1038;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar11 = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
                puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
              }
              local_1038._112_4_ = local_d98._112_4_;
              local_1038[0x74] = local_d98[0x74];
              local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_d98._120_8_;
              pcVar12 = &eps->m_backend;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_1038,pcVar12);
            if (((local_e28._120_4_ != cpp_dec_float_NaN) &&
                ((fpclass_type)local_fc0 != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_e28,
                                   (cpp_dec_float<200U,_int,_void> *)local_1038), iVar6 < 1)) {
              local_fa8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             extract_double(&local_a98);
              local_e48 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          extract_double(&local_b18);
              RVar3 = Random::next_random(local_da8);
              local_f00 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              local_f78._0_4_ = 0;
              local_f78._4_4_ = 0;
              local_f78._8_4_ = 0;
              local_f78._12_4_ = 0;
              local_f78._16_4_ = 0;
              local_f78._20_4_ = 0;
              local_f78._24_4_ = 0;
              local_f78._28_4_ = 0;
              local_f78._32_4_ = 0;
              local_f78._36_4_ = 0;
              local_f78._40_4_ = 0;
              local_f78._44_4_ = 0;
              local_f78._48_4_ = 0;
              local_f78._52_4_ = 0;
              local_f78._56_4_ = 0;
              local_f78._60_4_ = 0;
              local_f78._64_4_ = 0;
              local_f78._68_4_ = 0;
              local_f78._72_4_ = 0;
              local_f78._76_4_ = 0;
              local_f78._80_4_ = 0;
              local_f78._84_4_ = 0;
              local_f78._88_4_ = 0;
              local_f78._92_4_ = 0;
              local_f78._96_4_ = 0;
              local_f78._100_4_ = 0;
              local_f78._104_5_ = 0;
              local_f78._109_3_ = 0;
              local_f78._112_4_ = 0;
              local_f78[0x74] = false;
              local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              local_1038._0_4_ = 0;
              local_1038._4_4_ = 0;
              local_1038._8_4_ = 0;
              local_1038._12_4_ = 0;
              local_1038._16_4_ = 0;
              local_1038._20_4_ = 0;
              local_1038._24_4_ = 0;
              local_1038._28_4_ = 0;
              local_1038._32_4_ = 0;
              local_1038._36_4_ = 0;
              local_1038._40_4_ = 0;
              local_1038._44_4_ = 0;
              local_1038._48_4_ = 0;
              local_1038._52_4_ = 0;
              local_1038._56_4_ = 0;
              local_1038._60_4_ = 0;
              local_1038._64_4_ = 0;
              local_1038._68_4_ = 0;
              local_1038._72_4_ = 0;
              local_1038._76_4_ = 0;
              local_1038._80_4_ = 0;
              local_1038._84_4_ = 0;
              local_1038._88_4_ = 0;
              local_1038._92_4_ = 0;
              local_1038._96_4_ = 0;
              local_1038._100_4_ = 0;
              local_1038._104_5_ = 0;
              local_1038._109_3_ = 0;
              local_1038._112_4_ = 0;
              local_1038[0x74] = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_1038,
                         RVar3 * local_e48 + (1.0 - RVar3) * (double)local_fa8);
              puVar11 = (uint *)local_d98;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_f78;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar12->data)._M_elems[0] = *puVar11;
                puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
              }
              local_f78._112_4_ = local_d98._112_4_;
              local_f78[0x74] = local_d98[0x74];
              local_f00 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_d98._120_8_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_f78,
                         (cpp_dec_float<200U,_int,_void> *)local_1038);
              pnVar10 = (p_up->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_f78;
              pnVar13 = pnVar10 + uVar21;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar13->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
                pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              pnVar10[uVar21].m_backend.exp = local_f78._112_4_;
              pnVar10[uVar21].m_backend.neg = local_f78[0x74];
              *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)&pnVar10[uVar21].m_backend.fpclass = local_f00;
              pnVar10 = (p_up->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar21;
              local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              local_1038._0_4_ = 0;
              local_1038._4_4_ = 0;
              local_1038._8_4_ = 0;
              local_1038._12_4_ = 0;
              local_1038._16_4_ = 0;
              local_1038._20_4_ = 0;
              local_1038._24_4_ = 0;
              local_1038._28_4_ = 0;
              local_1038._32_4_ = 0;
              local_1038._36_4_ = 0;
              local_1038._40_4_ = 0;
              local_1038._44_4_ = 0;
              local_1038._48_4_ = 0;
              local_1038._52_4_ = 0;
              local_1038._56_4_ = 0;
              local_1038._60_4_ = 0;
              local_1038._64_4_ = 0;
              local_1038._68_4_ = 0;
              local_1038._72_4_ = 0;
              local_1038._76_4_ = 0;
              local_1038._80_4_ = 0;
              local_1038._84_4_ = 0;
              local_1038._88_4_ = 0;
              local_1038._92_4_ = 0;
              local_1038._96_4_ = 0;
              local_1038._100_4_ = 0;
              local_1038._104_5_ = 0;
              local_1038._109_3_ = 0;
              local_1038._112_4_ = 0;
              local_1038[0x74] = false;
              if ((pointer)local_1038 != pnVar10) {
                pnVar13 = pnVar10;
                puVar15 = (undefined4 *)local_1038;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  *puVar15 = (pnVar13->m_backend).data._M_elems[0];
                  pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
                  puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                }
                local_1038._112_4_ = (pnVar10->m_backend).exp;
                local_1038[0x74] = (pnVar10->m_backend).neg;
                local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              **)&(pnVar10->m_backend).fpclass;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1038,
                         (cpp_dec_float<200U,_int,_void> *)local_e28);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_fb0,
                         (cpp_dec_float<200U,_int,_void> *)local_1038);
            }
          }
        }
        bVar5 = local_ec8[0x74];
        uVar4 = local_ec8._112_4_;
        puVar15 = (undefined4 *)local_ec8;
        puVar17 = local_a0;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar17 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
        }
        local_fa8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_ec8._120_8_;
        uStack_fa0 = 0;
        ::soplex::infinity::__tls_init();
        local_c18.fpclass = cpp_dec_float_finite;
        local_c18.prec_elem = 0x1c;
        local_c18.data._M_elems[0] = 0;
        local_c18.data._M_elems[1] = 0;
        local_c18.data._M_elems[2] = 0;
        local_c18.data._M_elems[3] = 0;
        local_c18.data._M_elems[4] = 0;
        local_c18.data._M_elems[5] = 0;
        local_c18.data._M_elems[6] = 0;
        local_c18.data._M_elems[7] = 0;
        local_c18.data._M_elems[8] = 0;
        local_c18.data._M_elems[9] = 0;
        local_c18.data._M_elems[10] = 0;
        local_c18.data._M_elems[0xb] = 0;
        local_c18.data._M_elems[0xc] = 0;
        local_c18.data._M_elems[0xd] = 0;
        local_c18.data._M_elems[0xe] = 0;
        local_c18.data._M_elems[0xf] = 0;
        local_c18.data._M_elems[0x10] = 0;
        local_c18.data._M_elems[0x11] = 0;
        local_c18.data._M_elems[0x12] = 0;
        local_c18.data._M_elems[0x13] = 0;
        local_c18.data._M_elems[0x14] = 0;
        local_c18.data._M_elems[0x15] = 0;
        local_c18.data._M_elems[0x16] = 0;
        local_c18.data._M_elems[0x17] = 0;
        local_c18.data._M_elems[0x18] = 0;
        local_c18.data._M_elems[0x19] = 0;
        local_c18.data._M_elems._104_5_ = 0;
        local_c18.data._M_elems[0x1b]._1_3_ = 0;
        local_c18.exp = 0;
        local_c18.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_c18,(double)local_ef8);
        pnVar14 = eps;
        pcVar12 = &local_990;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar12->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar23 * -2 + 1) * 4)
          ;
        }
        local_990.exp = (eps->m_backend).exp;
        local_990.neg = (eps->m_backend).neg;
        local_990.fpclass = (eps->m_backend).fpclass;
        local_990.prec_elem = (eps->m_backend).prec_elem;
        puVar15 = local_a0;
        puVar17 = (undefined4 *)local_1038;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar17 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
        }
        local_1038._112_4_ = uVar4;
        local_1038[0x74] = bVar5;
        local_fc0 = local_fa8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)local_1038,&local_c18);
        p_up = local_f98;
        if (((fpclass_type)local_fc0 != cpp_dec_float_NaN) &&
           (local_990.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,&local_990);
          p_up = local_f98;
          if (0 < iVar6) {
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_390;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_390._112_4_ = local_ec8._112_4_;
            local_390[0x74] = local_ec8[0x74];
            local_390._120_8_ = local_ec8._120_8_;
            puVar11 = (uint *)local_e28;
            pnVar14 = &local_410;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = *puVar11;
              puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_410.m_backend.exp = local_e28._112_4_;
            local_410.m_backend.neg = local_e28[0x74];
            local_410.m_backend.fpclass = local_e28._120_4_;
            local_410.m_backend.prec_elem = iStack_dac;
            pnVar14 = eps;
            pnVar18 = &local_490;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_490.m_backend.exp = (eps->m_backend).exp;
            local_490.m_backend.neg = (eps->m_backend).neg;
            local_490.m_backend.fpclass = (eps->m_backend).fpclass;
            local_490.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar5 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_390,&local_410,&local_490);
            p_up = local_f98;
            if (bVar5) {
              local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              local_1038._0_4_ = 0;
              local_1038._4_4_ = 0;
              local_1038._8_4_ = 0;
              local_1038._12_4_ = 0;
              local_1038._16_4_ = 0;
              local_1038._20_4_ = 0;
              local_1038._24_4_ = 0;
              local_1038._28_4_ = 0;
              local_1038._32_4_ = 0;
              local_1038._36_4_ = 0;
              local_1038._40_4_ = 0;
              local_1038._44_4_ = 0;
              local_1038._48_4_ = 0;
              local_1038._52_4_ = 0;
              local_1038._56_4_ = 0;
              local_1038._60_4_ = 0;
              local_1038._64_4_ = 0;
              local_1038._68_4_ = 0;
              local_1038._72_4_ = 0;
              local_1038._76_4_ = 0;
              local_1038._80_4_ = 0;
              local_1038._84_4_ = 0;
              local_1038._88_4_ = 0;
              local_1038._92_4_ = 0;
              local_1038._96_4_ = 0;
              local_1038._100_4_ = 0;
              local_1038._104_5_ = 0;
              local_1038._109_3_ = 0;
              local_1038._112_4_ = 0;
              local_1038[0x74] = false;
              if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_1038 == eps) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1038,
                           (cpp_dec_float<200U,_int,_void> *)local_d98);
                if (local_1038._0_4_ != 0 || (fpclass_type)local_fc0 != cpp_dec_float_finite) {
                  local_1038[0x74] = local_1038[0x74] ^ 1;
                }
              }
              else {
                puVar15 = (undefined4 *)local_d98;
                puVar17 = (undefined4 *)local_1038;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  *puVar17 = *puVar15;
                  puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                  puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
                }
                local_1038._112_4_ = local_d98._112_4_;
                local_1038[0x74] = local_d98[0x74];
                local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_d98._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1038,&eps->m_backend);
              }
              if (((local_ec8._120_4_ != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_fc0 != cpp_dec_float_NaN)) &&
                 (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                                     (cpp_dec_float<200U,_int,_void> *)local_1038), -1 < iVar6)) {
                local_fa8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               extract_double(&local_a98);
                local_e48 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            extract_double(&local_b18);
                RVar3 = Random::next_random(local_da8);
                local_f00 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1c00000000;
                local_f78._0_4_ = 0;
                local_f78._4_4_ = 0;
                local_f78._8_4_ = 0;
                local_f78._12_4_ = 0;
                local_f78._16_4_ = 0;
                local_f78._20_4_ = 0;
                local_f78._24_4_ = 0;
                local_f78._28_4_ = 0;
                local_f78._32_4_ = 0;
                local_f78._36_4_ = 0;
                local_f78._40_4_ = 0;
                local_f78._44_4_ = 0;
                local_f78._48_4_ = 0;
                local_f78._52_4_ = 0;
                local_f78._56_4_ = 0;
                local_f78._60_4_ = 0;
                local_f78._64_4_ = 0;
                local_f78._68_4_ = 0;
                local_f78._72_4_ = 0;
                local_f78._76_4_ = 0;
                local_f78._80_4_ = 0;
                local_f78._84_4_ = 0;
                local_f78._88_4_ = 0;
                local_f78._92_4_ = 0;
                local_f78._96_4_ = 0;
                local_f78._100_4_ = 0;
                local_f78._104_5_ = 0;
                local_f78._109_3_ = 0;
                local_f78._112_4_ = 0;
                local_f78[0x74] = false;
                local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1c00000000;
                local_1038._0_4_ = 0;
                local_1038._4_4_ = 0;
                local_1038._8_4_ = 0;
                local_1038._12_4_ = 0;
                local_1038._16_4_ = 0;
                local_1038._20_4_ = 0;
                local_1038._24_4_ = 0;
                local_1038._28_4_ = 0;
                local_1038._32_4_ = 0;
                local_1038._36_4_ = 0;
                local_1038._40_4_ = 0;
                local_1038._44_4_ = 0;
                local_1038._48_4_ = 0;
                local_1038._52_4_ = 0;
                local_1038._56_4_ = 0;
                local_1038._60_4_ = 0;
                local_1038._64_4_ = 0;
                local_1038._68_4_ = 0;
                local_1038._72_4_ = 0;
                local_1038._76_4_ = 0;
                local_1038._80_4_ = 0;
                local_1038._84_4_ = 0;
                local_1038._88_4_ = 0;
                local_1038._92_4_ = 0;
                local_1038._96_4_ = 0;
                local_1038._100_4_ = 0;
                local_1038._104_5_ = 0;
                local_1038._109_3_ = 0;
                local_1038._112_4_ = 0;
                local_1038[0x74] = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_1038,
                           RVar3 * local_e48 + (1.0 - RVar3) * (double)local_fa8);
                puVar11 = (uint *)local_d98;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_f78;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                }
                local_f78._112_4_ = local_d98._112_4_;
                local_f78[0x74] = local_d98[0x74];
                local_f00 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_d98._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_f78,
                           (cpp_dec_float<200U,_int,_void> *)local_1038);
                pnVar10 = (local_f90->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_f78;
                pnVar13 = pnVar10 + uVar21;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar13->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                  pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                pnVar10[uVar21].m_backend.exp = local_f78._112_4_;
                pnVar10[uVar21].m_backend.neg = local_f78[0x74];
                *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)&pnVar10[uVar21].m_backend.fpclass = local_f00;
                pnVar10 = (local_f90->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar21;
                local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1c00000000;
                local_1038._0_4_ = 0;
                local_1038._4_4_ = 0;
                local_1038._8_4_ = 0;
                local_1038._12_4_ = 0;
                local_1038._16_4_ = 0;
                local_1038._20_4_ = 0;
                local_1038._24_4_ = 0;
                local_1038._28_4_ = 0;
                local_1038._32_4_ = 0;
                local_1038._36_4_ = 0;
                local_1038._40_4_ = 0;
                local_1038._44_4_ = 0;
                local_1038._48_4_ = 0;
                local_1038._52_4_ = 0;
                local_1038._56_4_ = 0;
                local_1038._60_4_ = 0;
                local_1038._64_4_ = 0;
                local_1038._68_4_ = 0;
                local_1038._72_4_ = 0;
                local_1038._76_4_ = 0;
                local_1038._80_4_ = 0;
                local_1038._84_4_ = 0;
                local_1038._88_4_ = 0;
                local_1038._92_4_ = 0;
                local_1038._96_4_ = 0;
                local_1038._100_4_ = 0;
                local_1038._104_5_ = 0;
                local_1038._109_3_ = 0;
                local_1038._112_4_ = 0;
                local_1038[0x74] = false;
                if ((pointer)local_1038 != pnVar10) {
                  pnVar13 = pnVar10;
                  puVar15 = (undefined4 *)local_1038;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    *puVar15 = (pnVar13->m_backend).data._M_elems[0];
                    pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
                    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                  }
                  local_1038._112_4_ = (pnVar10->m_backend).exp;
                  local_1038[0x74] = (pnVar10->m_backend).neg;
                  local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                **)&(pnVar10->m_backend).fpclass;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1038,
                           (cpp_dec_float<200U,_int,_void> *)local_ec8);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_fb0,
                           (cpp_dec_float<200U,_int,_void> *)local_1038);
              }
            }
          }
        }
        uVar20 = (int)local_ed0 - incr;
      } while (-1 < (int)uVar20);
    }
  }
  else {
    uVar20 = ~start + (local_fa8->thedelta).super_IdxSet.num;
    if (-1 < (int)uVar20) {
      pnVar10 = (local_fa8->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_ed0 = &local_fb0->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_e48 = *(double *)(in_FS_OFFSET + -8);
      local_e30 = &local_fb0->random;
      local_e38 = &(local_fb0->theShift).m_backend;
      uStack_e40 = 0;
      local_da8 = (Random *)-local_e48;
      uStack_da0 = 0x8000000000000000;
      pUVar22 = local_fa8;
      do {
        iVar6 = (pUVar22->thedelta).super_IdxSet.idx[uVar20];
        pnVar13 = pnVar10 + iVar6;
        puVar15 = (undefined4 *)local_d98;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_d98._112_4_ = pnVar10[iVar6].m_backend.exp;
        local_d98[0x74] = pnVar10[iVar6].m_backend.neg;
        local_d98._120_4_ = pnVar10[iVar6].m_backend.fpclass;
        local_d98._124_4_ = pnVar10[iVar6].m_backend.prec_elem;
        pnVar13 = (p_up->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = pnVar13 + iVar6;
        puVar15 = (undefined4 *)local_e28;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_e28._112_4_ = pnVar13[iVar6].m_backend.exp;
        local_e28[0x74] = pnVar13[iVar6].m_backend.neg;
        unique0x00012000 =
             *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **)&pnVar13[iVar6].m_backend.fpclass;
        pnVar13 = (local_f90->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = pnVar13 + iVar6;
        puVar15 = (undefined4 *)local_ec8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_ec8._112_4_ = pnVar13[iVar6].m_backend.exp;
        local_ec8[0x74] = pnVar13[iVar6].m_backend.neg;
        local_ec8._120_8_ = *(undefined8 *)&pnVar13[iVar6].m_backend.fpclass;
        SVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::dualStatus(local_ed0,
                             (local_fb0->
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).theBaseId.data + iVar6);
        if (SVar7 != D_ON_BOTH) {
          pnVar14 = eps;
          puVar11 = (uint *)local_1038;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar11 = (pnVar14->m_backend).data._M_elems[0];
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
            puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
          }
          local_1038._112_4_ = (eps->m_backend).exp;
          local_1038[0x74] = (eps->m_backend).neg;
          local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        **)&(eps->m_backend).fpclass;
          if (local_1038._0_4_ != 0 || (int)local_fc0 != 0) {
            local_1038[0x74] = local_1038[0x74] ^ 1;
          }
          if ((((int)local_fc0 == 2) || (local_d98._120_4_ == cpp_dec_float_NaN)) ||
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_d98,
                                 (cpp_dec_float<200U,_int,_void> *)local_1038), -1 < iVar8)) {
            if (((local_d98._120_4_ != cpp_dec_float_NaN) &&
                ((eps->m_backend).fpclass != cpp_dec_float_NaN)) &&
               (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_d98,&eps->m_backend),
               bVar5 = local_ec8[0x74], 0 < iVar8)) {
              puVar15 = (undefined4 *)local_ec8;
              puVar17 = local_110;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar17 = *puVar15;
                puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
              }
              local_f88 = (cpp_dec_float<200U,_int,_void> *)
                          CONCAT44(local_f88._4_4_,local_ec8._112_4_);
              local_ef8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_ec8._120_8_;
              uStack_ef0 = 0;
              ::soplex::infinity::__tls_init();
              local_d18.fpclass = cpp_dec_float_finite;
              local_d18.prec_elem = 0x1c;
              local_d18.data._M_elems[0] = 0;
              local_d18.data._M_elems[1] = 0;
              local_d18.data._M_elems[2] = 0;
              local_d18.data._M_elems[3] = 0;
              local_d18.data._M_elems[4] = 0;
              local_d18.data._M_elems[5] = 0;
              local_d18.data._M_elems[6] = 0;
              local_d18.data._M_elems[7] = 0;
              local_d18.data._M_elems[8] = 0;
              local_d18.data._M_elems[9] = 0;
              local_d18.data._M_elems[10] = 0;
              local_d18.data._M_elems[0xb] = 0;
              local_d18.data._M_elems[0xc] = 0;
              local_d18.data._M_elems[0xd] = 0;
              local_d18.data._M_elems[0xe] = 0;
              local_d18.data._M_elems[0xf] = 0;
              local_d18.data._M_elems[0x10] = 0;
              local_d18.data._M_elems[0x11] = 0;
              local_d18.data._M_elems[0x12] = 0;
              local_d18.data._M_elems[0x13] = 0;
              local_d18.data._M_elems[0x14] = 0;
              local_d18.data._M_elems[0x15] = 0;
              local_d18.data._M_elems[0x16] = 0;
              local_d18.data._M_elems[0x17] = 0;
              local_d18.data._M_elems[0x18] = 0;
              local_d18.data._M_elems[0x19] = 0;
              local_d18.data._M_elems._104_5_ = 0;
              local_d18.data._M_elems[0x1b]._1_3_ = 0;
              local_d18.exp = 0;
              local_d18.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_d18,(double)local_da8);
              pnVar14 = eps;
              pcVar12 = &local_a10;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar12->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar12 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_a10.exp = (eps->m_backend).exp;
              local_a10.neg = (eps->m_backend).neg;
              local_a10.fpclass = (eps->m_backend).fpclass;
              local_a10.prec_elem = (eps->m_backend).prec_elem;
              puVar15 = local_110;
              puVar17 = (undefined4 *)local_1038;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar17 = *puVar15;
                puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
              }
              local_1038._112_4_ = (int)local_f88;
              local_1038[0x74] = bVar5;
              local_fc0 = local_ef8;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1038,&local_d18);
              p_up = local_f98;
              pUVar22 = local_fa8;
              if ((((fpclass_type)local_fc0 != cpp_dec_float_NaN) &&
                  (local_a10.fpclass != cpp_dec_float_NaN)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_1038,&local_a10),
                 p_up = local_f98, pUVar22 = local_fa8, 0 < iVar8)) {
                puVar11 = (uint *)local_ec8;
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_710;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar14->m_backend).data._M_elems[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                local_710._112_4_ = local_ec8._112_4_;
                local_710[0x74] = local_ec8[0x74];
                local_710._120_8_ = local_ec8._120_8_;
                puVar11 = (uint *)local_e28;
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_790;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar14->m_backend).data._M_elems[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                local_790._112_4_ = local_e28._112_4_;
                local_790[0x74] = local_e28[0x74];
                local_790._120_8_ = stack0xfffffffffffff250;
                pnVar14 = eps;
                pnVar18 = &local_810;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
                  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                  pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                local_810.m_backend.exp = (eps->m_backend).exp;
                local_810.m_backend.neg = (eps->m_backend).neg;
                local_810.m_backend.fpclass = (eps->m_backend).fpclass;
                local_810.m_backend.prec_elem = (eps->m_backend).prec_elem;
                bVar5 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_710,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_790,&local_810);
                if (bVar5) {
                  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1c00000000;
                  local_1038._0_4_ = 0;
                  local_1038._4_4_ = 0;
                  local_1038._8_4_ = 0;
                  local_1038._12_4_ = 0;
                  local_1038._16_4_ = 0;
                  local_1038._20_4_ = 0;
                  local_1038._24_4_ = 0;
                  local_1038._28_4_ = 0;
                  local_1038._32_4_ = 0;
                  local_1038._36_4_ = 0;
                  local_1038._40_4_ = 0;
                  local_1038._44_4_ = 0;
                  local_1038._48_4_ = 0;
                  local_1038._52_4_ = 0;
                  local_1038._56_4_ = 0;
                  local_1038._60_4_ = 0;
                  local_1038._64_4_ = 0;
                  local_1038._68_4_ = 0;
                  local_1038._72_4_ = 0;
                  local_1038._76_4_ = 0;
                  local_1038._80_4_ = 0;
                  local_1038._84_4_ = 0;
                  local_1038._88_4_ = 0;
                  local_1038._92_4_ = 0;
                  local_1038._96_4_ = 0;
                  local_1038._100_4_ = 0;
                  local_1038._104_5_ = 0;
                  local_1038._109_3_ = 0;
                  local_1038._112_4_ = 0;
                  local_1038[0x74] = false;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
                  if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_1038 != eps) {
                    puVar11 = (uint *)local_1038;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      *puVar11 = (pcVar12->data)._M_elems[0];
                      pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                      puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                    }
                    local_1038._112_4_ = local_ec8._112_4_;
                    local_1038[0x74] = local_ec8[0x74];
                    local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)local_ec8._120_8_;
                    pcVar12 = &eps->m_backend;
                  }
                  local_f88 = &local_ed8[iVar6].m_backend;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,pcVar12);
                  if (((local_f88->fpclass != cpp_dec_float_NaN) &&
                      ((fpclass_type)local_fc0 != cpp_dec_float_NaN)) &&
                     (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(local_f88,(cpp_dec_float<200U,_int,_void> *)local_1038),
                     iVar8 < 1)) {
                    local_ef8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   extract_double(&local_a98);
                    local_ee0 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                extract_double(&local_b18);
                    RVar3 = Random::next_random(local_e30);
                    local_f00 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x1c00000000;
                    local_f78._0_4_ = 0;
                    local_f78._4_4_ = 0;
                    local_f78._8_4_ = 0;
                    local_f78._12_4_ = 0;
                    local_f78._16_4_ = 0;
                    local_f78._20_4_ = 0;
                    local_f78._24_4_ = 0;
                    local_f78._28_4_ = 0;
                    local_f78._32_4_ = 0;
                    local_f78._36_4_ = 0;
                    local_f78._40_4_ = 0;
                    local_f78._44_4_ = 0;
                    local_f78._48_4_ = 0;
                    local_f78._52_4_ = 0;
                    local_f78._56_4_ = 0;
                    local_f78._60_4_ = 0;
                    local_f78._64_4_ = 0;
                    local_f78._68_4_ = 0;
                    local_f78._72_4_ = 0;
                    local_f78._76_4_ = 0;
                    local_f78._80_4_ = 0;
                    local_f78._84_4_ = 0;
                    local_f78._88_4_ = 0;
                    local_f78._92_4_ = 0;
                    local_f78._96_4_ = 0;
                    local_f78._100_4_ = 0;
                    local_f78._104_5_ = 0;
                    local_f78._109_3_ = 0;
                    local_f78._112_4_ = 0;
                    local_f78[0x74] = false;
                    local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x1c00000000;
                    local_1038._0_4_ = 0;
                    local_1038._4_4_ = 0;
                    local_1038._8_4_ = 0;
                    local_1038._12_4_ = 0;
                    local_1038._16_4_ = 0;
                    local_1038._20_4_ = 0;
                    local_1038._24_4_ = 0;
                    local_1038._28_4_ = 0;
                    local_1038._32_4_ = 0;
                    local_1038._36_4_ = 0;
                    local_1038._40_4_ = 0;
                    local_1038._44_4_ = 0;
                    local_1038._48_4_ = 0;
                    local_1038._52_4_ = 0;
                    local_1038._56_4_ = 0;
                    local_1038._60_4_ = 0;
                    local_1038._64_4_ = 0;
                    local_1038._68_4_ = 0;
                    local_1038._72_4_ = 0;
                    local_1038._76_4_ = 0;
                    local_1038._80_4_ = 0;
                    local_1038._84_4_ = 0;
                    local_1038._88_4_ = 0;
                    local_1038._92_4_ = 0;
                    local_1038._96_4_ = 0;
                    local_1038._100_4_ = 0;
                    local_1038._104_5_ = 0;
                    local_1038._109_3_ = 0;
                    local_1038._112_4_ = 0;
                    local_1038[0x74] = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_1038,
                               RVar3 * local_ee0 + (1.0 - RVar3) * (double)local_ef8);
                    if ((cpp_dec_float<200U,_int,_void> *)local_f78 != local_f88) {
                      pcVar12 = local_f88;
                      pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_f78;
                      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                        (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                        pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                        pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar19 + (ulong)bVar23 * -8 + 4);
                      }
                      local_f78._112_4_ = local_f88->exp;
                      local_f78[0x74] = local_f88->neg;
                      local_f00 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    **)&local_f88->fpclass;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_f78,
                               (cpp_dec_float<200U,_int,_void> *)local_1038);
                    pnVar13 = (local_f90->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    puVar15 = (undefined4 *)local_f78;
                    pnVar16 = pnVar13 + iVar6;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      (pnVar16->m_backend).data._M_elems[0] = *puVar15;
                      puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                    }
                    pnVar13[iVar6].m_backend.exp = local_f78._112_4_;
                    pnVar13[iVar6].m_backend.neg = local_f78[0x74];
                    *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)&pnVar13[iVar6].m_backend.fpclass = local_f00;
                    pnVar13 = (local_f90->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + iVar6;
                    local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x1c00000000;
                    local_1038._0_4_ = 0;
                    local_1038._4_4_ = 0;
                    local_1038._8_4_ = 0;
                    local_1038._12_4_ = 0;
                    local_1038._16_4_ = 0;
                    local_1038._20_4_ = 0;
                    local_1038._24_4_ = 0;
                    local_1038._28_4_ = 0;
                    local_1038._32_4_ = 0;
                    local_1038._36_4_ = 0;
                    local_1038._40_4_ = 0;
                    local_1038._44_4_ = 0;
                    local_1038._48_4_ = 0;
                    local_1038._52_4_ = 0;
                    local_1038._56_4_ = 0;
                    local_1038._60_4_ = 0;
                    local_1038._64_4_ = 0;
                    local_1038._68_4_ = 0;
                    local_1038._72_4_ = 0;
                    local_1038._76_4_ = 0;
                    local_1038._80_4_ = 0;
                    local_1038._84_4_ = 0;
                    local_1038._88_4_ = 0;
                    local_1038._92_4_ = 0;
                    local_1038._96_4_ = 0;
                    local_1038._100_4_ = 0;
                    local_1038._104_5_ = 0;
                    local_1038._109_3_ = 0;
                    local_1038._112_4_ = 0;
                    local_1038[0x74] = false;
                    if ((pointer)local_1038 != pnVar13) {
                      pnVar16 = pnVar13;
                      puVar15 = (undefined4 *)local_1038;
                      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                        *puVar15 = (pnVar16->m_backend).data._M_elems[0];
                        pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                      }
                      local_1038._112_4_ = (pnVar13->m_backend).exp;
                      local_1038[0x74] = (pnVar13->m_backend).neg;
                      local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    **)&(pnVar13->m_backend).fpclass;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_1038,
                               (cpp_dec_float<200U,_int,_void> *)local_ec8);
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              (local_e38,(cpp_dec_float<200U,_int,_void> *)local_1038);
                    pUVar22 = local_fa8;
                  }
                }
              }
            }
          }
          else {
            puVar15 = (undefined4 *)local_e28;
            puVar17 = (undefined4 *)local_890;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar17 = *puVar15;
              puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
              puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
            }
            local_890._112_4_ = local_e28._112_4_;
            local_890[0x74] = local_e28[0x74];
            local_890._120_8_ = stack0xfffffffffffff250;
            ::soplex::infinity::__tls_init();
            local_c20 = 0x1c00000000;
            local_c98 = 0;
            uStack_c90 = 0;
            local_c88 = 0;
            uStack_c80 = 0;
            local_c78 = 0;
            uStack_c70 = 0;
            local_c68 = 0;
            uStack_c60 = 0;
            local_c58 = 0;
            uStack_c50 = 0;
            local_c48 = 0;
            uStack_c40 = 0;
            local_c38 = 0;
            uStack_c30 = 0;
            uStack_c2b = 0;
            uStack_c28 = 0;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_c98,local_e48);
            pnVar14 = eps;
            pnVar18 = &local_510;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_510.m_backend.exp = (eps->m_backend).exp;
            local_510.m_backend.neg = (eps->m_backend).neg;
            local_510.m_backend.fpclass = (eps->m_backend).fpclass;
            local_510.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_890,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_c98,&local_510);
            pUVar22 = local_fa8;
            if (bVar5) {
              puVar11 = (uint *)local_ec8;
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_590;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar14->m_backend).data._M_elems[0] = *puVar11;
                puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_590._112_4_ = local_ec8._112_4_;
              local_590[0x74] = local_ec8[0x74];
              local_590._120_8_ = local_ec8._120_8_;
              puVar11 = (uint *)local_e28;
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_610;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar14->m_backend).data._M_elems[0] = *puVar11;
                puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_610._112_4_ = local_e28._112_4_;
              local_610[0x74] = local_e28[0x74];
              local_610._120_8_ = stack0xfffffffffffff250;
              pnVar14 = eps;
              pnVar18 = &local_690;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_690.m_backend.exp = (eps->m_backend).exp;
              local_690.m_backend.neg = (eps->m_backend).neg;
              local_690.m_backend.fpclass = (eps->m_backend).fpclass;
              local_690.m_backend.prec_elem = (eps->m_backend).prec_elem;
              bVar5 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_590,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_610,&local_690);
              pUVar22 = local_fa8;
              if (bVar5) {
                local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1c00000000;
                local_1038._0_4_ = 0;
                local_1038._4_4_ = 0;
                local_1038._8_4_ = 0;
                local_1038._12_4_ = 0;
                local_1038._16_4_ = 0;
                local_1038._20_4_ = 0;
                local_1038._24_4_ = 0;
                local_1038._28_4_ = 0;
                local_1038._32_4_ = 0;
                local_1038._36_4_ = 0;
                local_1038._40_4_ = 0;
                local_1038._44_4_ = 0;
                local_1038._48_4_ = 0;
                local_1038._52_4_ = 0;
                local_1038._56_4_ = 0;
                local_1038._60_4_ = 0;
                local_1038._64_4_ = 0;
                local_1038._68_4_ = 0;
                local_1038._72_4_ = 0;
                local_1038._76_4_ = 0;
                local_1038._80_4_ = 0;
                local_1038._84_4_ = 0;
                local_1038._88_4_ = 0;
                local_1038._92_4_ = 0;
                local_1038._96_4_ = 0;
                local_1038._100_4_ = 0;
                local_1038._104_5_ = 0;
                local_1038._109_3_ = 0;
                local_1038._112_4_ = 0;
                local_1038[0x74] = false;
                if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_1038 == eps) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,
                             (cpp_dec_float<200U,_int,_void> *)local_e28);
                  if (local_1038._0_4_ != 0 || (fpclass_type)local_fc0 != cpp_dec_float_finite) {
                    local_1038[0x74] = local_1038[0x74] ^ 1;
                  }
                }
                else {
                  puVar15 = (undefined4 *)local_e28;
                  puVar17 = (undefined4 *)local_1038;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    *puVar17 = *puVar15;
                    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                    puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
                  }
                  local_1038._112_4_ = local_e28._112_4_;
                  local_1038[0x74] = local_e28[0x74];
                  local_fc0 = stack0xfffffffffffff250;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,&eps->m_backend);
                }
                pcVar12 = &local_ed8[iVar6].m_backend;
                if (((pcVar12->fpclass != cpp_dec_float_NaN) &&
                    ((fpclass_type)local_fc0 != cpp_dec_float_NaN)) &&
                   (local_f88 = pcVar12,
                   iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (pcVar12,(cpp_dec_float<200U,_int,_void> *)local_1038),
                   -1 < iVar8)) {
                  local_ef8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 extract_double(&local_a98);
                  local_ee0 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              extract_double(&local_b18);
                  RVar3 = Random::next_random(local_e30);
                  local_f00 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1c00000000;
                  local_f78._0_4_ = 0;
                  local_f78._4_4_ = 0;
                  local_f78._8_4_ = 0;
                  local_f78._12_4_ = 0;
                  local_f78._16_4_ = 0;
                  local_f78._20_4_ = 0;
                  local_f78._24_4_ = 0;
                  local_f78._28_4_ = 0;
                  local_f78._32_4_ = 0;
                  local_f78._36_4_ = 0;
                  local_f78._40_4_ = 0;
                  local_f78._44_4_ = 0;
                  local_f78._48_4_ = 0;
                  local_f78._52_4_ = 0;
                  local_f78._56_4_ = 0;
                  local_f78._60_4_ = 0;
                  local_f78._64_4_ = 0;
                  local_f78._68_4_ = 0;
                  local_f78._72_4_ = 0;
                  local_f78._76_4_ = 0;
                  local_f78._80_4_ = 0;
                  local_f78._84_4_ = 0;
                  local_f78._88_4_ = 0;
                  local_f78._92_4_ = 0;
                  local_f78._96_4_ = 0;
                  local_f78._100_4_ = 0;
                  local_f78._104_5_ = 0;
                  local_f78._109_3_ = 0;
                  local_f78._112_4_ = 0;
                  local_f78[0x74] = false;
                  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1c00000000;
                  local_1038._0_4_ = 0;
                  local_1038._4_4_ = 0;
                  local_1038._8_4_ = 0;
                  local_1038._12_4_ = 0;
                  local_1038._16_4_ = 0;
                  local_1038._20_4_ = 0;
                  local_1038._24_4_ = 0;
                  local_1038._28_4_ = 0;
                  local_1038._32_4_ = 0;
                  local_1038._36_4_ = 0;
                  local_1038._40_4_ = 0;
                  local_1038._44_4_ = 0;
                  local_1038._48_4_ = 0;
                  local_1038._52_4_ = 0;
                  local_1038._56_4_ = 0;
                  local_1038._60_4_ = 0;
                  local_1038._64_4_ = 0;
                  local_1038._68_4_ = 0;
                  local_1038._72_4_ = 0;
                  local_1038._76_4_ = 0;
                  local_1038._80_4_ = 0;
                  local_1038._84_4_ = 0;
                  local_1038._88_4_ = 0;
                  local_1038._92_4_ = 0;
                  local_1038._96_4_ = 0;
                  local_1038._100_4_ = 0;
                  local_1038._104_5_ = 0;
                  local_1038._109_3_ = 0;
                  local_1038._112_4_ = 0;
                  local_1038[0x74] = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_1038,
                             RVar3 * local_ee0 + (1.0 - RVar3) * (double)local_ef8);
                  if ((cpp_dec_float<200U,_int,_void> *)local_f78 != local_f88) {
                    pcVar12 = local_f88;
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_f78;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                      pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                      pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar19 + (ulong)bVar23 * -8 + 4);
                    }
                    local_f78._112_4_ = local_f88->exp;
                    local_f78[0x74] = local_f88->neg;
                    local_f00 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  **)&local_f88->fpclass;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)local_f78,
                             (cpp_dec_float<200U,_int,_void> *)local_1038);
                  pnVar13 = (p_up->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar15 = (undefined4 *)local_f78;
                  pnVar16 = pnVar13 + iVar6;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    (pnVar16->m_backend).data._M_elems[0] = *puVar15;
                    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                    pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                  }
                  pnVar13[iVar6].m_backend.exp = local_f78._112_4_;
                  pnVar13[iVar6].m_backend.neg = local_f78[0x74];
                  *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)&pnVar13[iVar6].m_backend.fpclass = local_f00;
                  pnVar13 = (p_up->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar6;
                  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1c00000000;
                  local_1038._0_4_ = 0;
                  local_1038._4_4_ = 0;
                  local_1038._8_4_ = 0;
                  local_1038._12_4_ = 0;
                  local_1038._16_4_ = 0;
                  local_1038._20_4_ = 0;
                  local_1038._24_4_ = 0;
                  local_1038._28_4_ = 0;
                  local_1038._32_4_ = 0;
                  local_1038._36_4_ = 0;
                  local_1038._40_4_ = 0;
                  local_1038._44_4_ = 0;
                  local_1038._48_4_ = 0;
                  local_1038._52_4_ = 0;
                  local_1038._56_4_ = 0;
                  local_1038._60_4_ = 0;
                  local_1038._64_4_ = 0;
                  local_1038._68_4_ = 0;
                  local_1038._72_4_ = 0;
                  local_1038._76_4_ = 0;
                  local_1038._80_4_ = 0;
                  local_1038._84_4_ = 0;
                  local_1038._88_4_ = 0;
                  local_1038._92_4_ = 0;
                  local_1038._96_4_ = 0;
                  local_1038._100_4_ = 0;
                  local_1038._104_5_ = 0;
                  local_1038._109_3_ = 0;
                  local_1038._112_4_ = 0;
                  local_1038[0x74] = false;
                  if ((pointer)local_1038 != pnVar13) {
                    pnVar16 = pnVar13;
                    puVar15 = (undefined4 *)local_1038;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      *puVar15 = (pnVar16->m_backend).data._M_elems[0];
                      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                      puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                    }
                    local_1038._112_4_ = (pnVar13->m_backend).exp;
                    local_1038[0x74] = (pnVar13->m_backend).neg;
                    local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  **)&(pnVar13->m_backend).fpclass;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,
                             (cpp_dec_float<200U,_int,_void> *)local_e28);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            (local_e38,(cpp_dec_float<200U,_int,_void> *)local_1038);
                  pUVar22 = local_fa8;
                }
              }
            }
          }
        }
        uVar20 = uVar20 - incr;
      } while (-1 < (int)uVar20);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMin(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps)
         {
            p_up[i] = x + random.next((double) minrandom, (double)maxrandom);
            theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps)
         {
            p_low[i] = x - random.next((double)minrandom, (double)maxrandom);
            theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         // do not permute these bounds! c.f. with computeFrhs2() in spxvecs.cpp
         if(this->dualStatus(this->baseId(i)) == SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            continue;
         }

         if(x < -eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               theShift += p_up[i] - u;
            }
         }
         else if(x > eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               theShift -= p_low[i] - l;
            }
         }
      }
   }
}